

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_definitions_section.cpp
# Opt level: O0

shared_ptr<const_pstore::repo::linked_definitions> __thiscall
pstore::repo::linked_definitions::load
          (linked_definitions *this,database *db,typed_address<pstore::repo::linked_definitions> ld)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> addr;
  element_type *this_00;
  size_t size;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_pstore::repo::linked_definitions> sVar1;
  undefined1 local_30 [8];
  shared_ptr<const_pstore::repo::linked_definitions> ln;
  database *db_local;
  typed_address<pstore::repo::linked_definitions> ld_local;
  
  ln.super___shared_ptr<const_pstore::repo::linked_definitions,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)db;
  database::getro<pstore::repo::linked_definitions,void>
            ((database *)local_30,(typed_address<pstore::repo::linked_definitions>)db);
  addr._M_pi = ln.
               super___shared_ptr<const_pstore::repo::linked_definitions,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
  this_00 = std::
            __shared_ptr_access<const_pstore::repo::linked_definitions,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_pstore::repo::linked_definitions,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_30);
  size = linked_definitions::size(this_00);
  size_bytes(size);
  database::getro<pstore::repo::linked_definitions,void>
            ((database *)this,(typed_address<pstore::repo::linked_definitions>)addr._M_pi,
             (size_t)ld.a_.a_);
  std::shared_ptr<const_pstore::repo::linked_definitions>::~shared_ptr
            ((shared_ptr<const_pstore::repo::linked_definitions> *)local_30);
  sVar1.super___shared_ptr<const_pstore::repo::linked_definitions,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_pstore::repo::linked_definitions,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this;
  return (shared_ptr<const_pstore::repo::linked_definitions>)
         sVar1.
         super___shared_ptr<const_pstore::repo::linked_definitions,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<linked_definitions const>
        linked_definitions::load (database const & db, typed_address<linked_definitions> const ld) {
            // First work out its size, then read the full-size of the object.
            std::shared_ptr<linked_definitions const> const ln = db.getro (ld);
            return db.getro (ld, linked_definitions::size_bytes (ln->size ()));
        }